

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utf16_le.c
# Opt level: O1

OnigCodePoint utf16le_mbc_to_code(OnigUChar *p,OnigUChar *end)

{
  if ((p[1] & 0xfc) == 0xd8) {
    return ((uint)p[2] | (*p & 0xc0) << 10 | (uint)p[1] << 0x12) +
           ((uint)p[3] + (*p & 0x3f) * 4) * 0x100 + 0xfca02400;
  }
  return (uint)*(ushort *)p;
}

Assistant:

static OnigCodePoint
utf16le_mbc_to_code(const UChar* p, const UChar* end ARG_UNUSED)
{
  OnigCodePoint code;
  UChar c0 = *p;
  UChar c1 = *(p+1);

  if (UTF16_IS_SURROGATE_FIRST(c1)) {
    code = ((((c1 - 0xd8) << 2) + ((c0  & 0xc0) >> 6) + 1) << 16)
         + ((((c0 & 0x3f) << 2) + (p[3] - 0xdc)) << 8)
         + p[2];
  }
  else {
    code = c1 * 256 + p[0];
  }
  return code;
}